

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Preferences.cxx
# Opt level: O2

void __thiscall Fl_Preferences::Node::~Node(Node *this)

{
  deleteAllChildren(this);
  deleteAllEntries(this);
  deleteIndex(this);
  if (this->path_ != (char *)0x0) {
    free(this->path_);
    this->path_ = (char *)0x0;
  }
  this->next_ = (Node *)0x0;
  (this->field_2).parent_ = (Node *)0x0;
  return;
}

Assistant:

Fl_Preferences::Node::~Node() {
  deleteAllChildren();
  deleteAllEntries();
  deleteIndex();
  if ( path_ ) {
    free( path_ );
    path_ = 0L;
  }
  next_ = 0L;
  parent_ = 0L;
}